

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowdiscrepancy.h
# Opt level: O2

float pbrt::SobolSampleFloat<pbrt::BinaryPermuteScrambler>
                (int64_t a,int dimension,BinaryPermuteScrambler randomizer)

{
  undefined1 auVar1 [16];
  uint *puVar2;
  uint uVar3;
  undefined1 in_ZMM0 [64];
  
  uVar3 = 0;
  puVar2 = (uint *)(SobolMatrices32 + (long)(dimension * 0x34) * 4);
  for (; a != 0; a = a >> 1) {
    if ((a & 1U) != 0) {
      uVar3 = uVar3 ^ *puVar2;
    }
    puVar2 = puVar2 + 1;
  }
  auVar1 = vcvtusi2ss_avx512f(in_ZMM0._0_16_,uVar3 ^ randomizer.permutation);
  auVar1 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),ZEXT416((uint)(auVar1._0_4_ * 2.3283064e-10)));
  return auVar1._0_4_;
}

Assistant:

PBRT_CPU_GPU inline float SobolSampleFloat(int64_t a, int dimension, R randomizer) {
    DCHECK_LT(dimension, NSobolDimensions);
    DCHECK(a >= 0 && a < (1ull << SobolMatrixSize));
    // Compute initial Sobol sample _v_ using generator matrices
    uint32_t v = 0;
    for (int i = dimension * SobolMatrixSize; a != 0; a >>= 1, i++)
        if (a & 1)
            v ^= SobolMatrices32[i];

    v = randomizer(v);
    return std::min(v * 0x1p-32f, FloatOneMinusEpsilon);
}